

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall pugi::xml_node::insert_move_after(xml_node *this,xml_node *moved,xml_node *node)

{
  ulong *puVar1;
  xml_node child;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  bool bVar5;
  xml_node xVar6;
  xml_node_struct **ppxVar7;
  xml_node_struct *pxVar8;
  xml_node_struct *pxVar9;
  
  xVar6 = (xml_node)this->_root;
  child = (xml_node)moved->_root;
  bVar5 = impl::anon_unknown_0::allow_move(xVar6,child);
  if (((bVar5) && (pxVar2 = node->_root, pxVar2 != (xml_node_struct *)0x0)) &&
     (child._root != pxVar2 && pxVar2->parent == xVar6._root)) {
    if (xVar6._root == (xml_node_struct *)0x0) {
      __assert_fail("object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x486,
                    "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                   );
    }
    puVar1 = (ulong *)(*(long *)((long)xVar6._root - ((xVar6._root)->header >> 8)) + -0x40);
    *puVar1 = *puVar1 | 0x40;
    pxVar2 = (child._root)->next_sibling;
    pxVar3 = (child._root)->parent;
    pxVar4 = (child._root)->prev_sibling_c;
    pxVar8 = pxVar2;
    if (pxVar2 == (xml_node_struct *)0x0) {
      pxVar8 = pxVar3->first_child;
    }
    pxVar8->prev_sibling_c = pxVar4;
    ppxVar7 = &pxVar3->first_child;
    if (pxVar4->next_sibling != (xml_node_struct *)0x0) {
      ppxVar7 = &pxVar4->next_sibling;
    }
    *ppxVar7 = pxVar2;
    (child._root)->parent = (xml_node_struct *)0x0;
    (child._root)->prev_sibling_c = (xml_node_struct *)0x0;
    (child._root)->next_sibling = (xml_node_struct *)0x0;
    pxVar2 = node->_root;
    pxVar3 = moved->_root;
    pxVar4 = pxVar2->parent;
    pxVar3->parent = pxVar4;
    pxVar8 = pxVar2->next_sibling;
    pxVar9 = pxVar8;
    if (pxVar8 == (xml_node_struct *)0x0) {
      pxVar9 = pxVar4->first_child;
    }
    pxVar9->prev_sibling_c = pxVar3;
    pxVar3->next_sibling = pxVar8;
    pxVar3->prev_sibling_c = pxVar2;
    pxVar2->next_sibling = pxVar3;
    xVar6 = (xml_node)moved->_root;
  }
  else {
    xVar6._root = (xml_node_struct *)0x0;
  }
  return (xml_node)xVar6._root;
}

Assistant:

PUGI__FN xml_node xml_node::insert_move_after(const xml_node& moved, const xml_node& node)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();
		if (moved._root == node._root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::insert_node_after(moved._root, node._root);

		return moved;
	}